

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O2

Expression * __thiscall
wasm::anon_unknown_0::AsyncifyBuilder::makeGetStackPos(AsyncifyBuilder *this)

{
  uintptr_t uVar1;
  size_t sVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  GlobalGet *pGVar6;
  Load *pLVar7;
  Name name;
  
  uVar4 = wasm::Type::getByteSize(&this->pointerType);
  uVar5 = wasm::Type::getByteSize(&this->pointerType);
  name.super_IString.str._M_str = DAT_00e63540;
  name.super_IString.str._M_len = wasm::(anonymous_namespace)::ASYNCIFY_DATA;
  pGVar6 = Builder::makeGlobalGet(&this->super_Builder,name,(Type)(this->pointerType).id);
  uVar1 = (this->pointerType).id;
  sVar2 = (this->asyncifyMemory).super_IString.str._M_len;
  pcVar3 = (this->asyncifyMemory).super_IString.str._M_str;
  pLVar7 = MixedArena::alloc<wasm::Load>(&((this->super_Builder).wasm)->allocator);
  pLVar7->isAtomic = false;
  pLVar7->bytes = (uint8_t)uVar4;
  pLVar7->signed_ = false;
  (pLVar7->offset).addr = 0;
  (pLVar7->align).addr = (ulong)uVar5;
  pLVar7->ptr = (Expression *)pGVar6;
  (pLVar7->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = uVar1;
  (pLVar7->memory).super_IString.str._M_len = sVar2;
  (pLVar7->memory).super_IString.str._M_str = pcVar3;
  return (Expression *)pLVar7;
}

Assistant:

Expression* makeGetStackPos() {
    return makeLoad(pointerType.getByteSize(),
                    false,
                    int(DataOffset::BStackPos),
                    pointerType.getByteSize(),
                    makeGlobalGet(ASYNCIFY_DATA, pointerType),
                    pointerType,
                    asyncifyMemory);
  }